

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall embree::Scene::printStatistics(Scene *this)

{
  pointer puVar1;
  uint uVar2;
  size_t sVar3;
  Geometry *pGVar4;
  char *__s;
  void *pvVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  ulong __new_size;
  size_t p;
  long lVar11;
  ulong uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> statistics [32];
  allocator local_359;
  undefined1 *local_358 [2];
  undefined1 local_348 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_338 [32];
  
  sVar3 = (this->geometries).size_active;
  if (sVar3 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    sVar9 = 0;
    do {
      pGVar4 = (this->geometries).items[sVar9].ptr;
      if ((pGVar4 != (Geometry *)0x0) && (uVar2 = pGVar4->numTimeSteps, uVar10 <= uVar2)) {
        uVar10 = uVar2;
      }
      sVar9 = sVar9 + 1;
    } while (sVar3 != sVar9);
  }
  lVar11 = 0;
  memset(local_338,0,0x300);
  __new_size = (ulong)uVar10;
  do {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&local_338[0].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar11),__new_size);
    lVar11 = lVar11 + 0x18;
  } while (lVar11 != 0x300);
  uVar12 = (this->geometries).size_active;
  if (uVar12 != 0) {
    uVar7 = 0;
    do {
      pGVar4 = (this->geometries).items[uVar7].ptr;
      if (pGVar4 != (Geometry *)0x0) {
        puVar1 = local_338[*(byte *)&pGVar4->field_8].
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)(pGVar4->numTimeSteps - 1);
        *puVar1 = *puVar1 + (ulong)pGVar4->numPrimitives;
        uVar12 = (this->geometries).size_active;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar12);
  }
  *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 0x17;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"segments",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  if (__new_size != 0) {
    uVar12 = 0;
    do {
      *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 10;
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      uVar12 = uVar12 + 1;
    } while (__new_size != uVar12);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-------------------------",0x19);
  uVar12 = __new_size;
  if (uVar10 != 0) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"----------",10);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  std::ostream::flush();
  lVar11 = 0;
  do {
    std::__cxx11::string::string((string *)local_358,(&Geometry::gtype_names)[lVar11],&local_359);
    iVar6 = std::__cxx11::string::compare((char *)local_358);
    if (local_358[0] != local_348) {
      operator_delete(local_358[0]);
    }
    if (iVar6 != 0) {
      *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 0x17;
      __s = (&Geometry::gtype_names)[lVar11];
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x21d41f8);
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar8);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
      if (uVar10 != 0) {
        uVar12 = 0;
        do {
          *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 10;
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          uVar12 = uVar12 + 1;
        } while (__new_size != uVar12);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x20);
  lVar11 = 0x2e8;
  do {
    pvVar5 = *(void **)((long)&local_338[0].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar11);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5);
    }
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  return;
}

Assistant:

void Scene::printStatistics()
  {
    /* calculate maximum number of time segments */
    unsigned max_time_steps = 0;
    for (size_t i=0; i<size(); i++) {
      if (!get(i)) continue;
      max_time_steps = max(max_time_steps,get(i)->numTimeSteps);
    }

    /* initialize vectors*/
    std::vector<size_t> statistics[Geometry::GTY_END];
    for (size_t i=0; i<Geometry::GTY_END; i++)
      statistics[i].resize(max_time_steps);

    /* gather statistics */
    for (size_t i=0; i<size(); i++) 
    {
      if (!get(i)) continue;
      int ty = get(i)->getType(); 
      assert(ty<Geometry::GTY_END);
      int timesegments = get(i)->numTimeSegments(); 
      assert((unsigned int)timesegments < max_time_steps);
      statistics[ty][timesegments] += get(i)->size();
    }

    /* print statistics */
    std::cout << std::setw(23) << "segments" << ": ";
    for (size_t t=0; t<max_time_steps; t++)
      std::cout << std::setw(10) << t;
    std::cout << std::endl;

    std::cout << "-------------------------";
    for (size_t t=0; t<max_time_steps; t++)
      std::cout << "----------";
    std::cout << std::endl;
    
    for (size_t p=0; p<Geometry::GTY_END; p++)
    {
      if (std::string(Geometry::gtype_names[p]) == "") continue;
      std::cout << std::setw(23) << Geometry::gtype_names[p] << ": ";
      for (size_t t=0; t<max_time_steps; t++)
        std::cout << std::setw(10) << statistics[p][t];
      std::cout << std::endl;
    }
  }